

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void * safegrowarray(void *ptr,size_t *allocated,size_t eltsize,size_t oldlen,size_t extralen,
                    _Bool secret)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  size_t n;
  void *local_70;
  void *toret;
  size_t newsize;
  size_t maxincr;
  size_t increment;
  size_t oldsize;
  size_t maxsize;
  _Bool secret_local;
  size_t extralen_local;
  size_t oldlen_local;
  size_t eltsize_local;
  size_t *allocated_local;
  void *ptr_local;
  
  if (eltsize == 0) {
    __assert_fail("eltsize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/memory.c"
                  ,0x58,"void *safegrowarray(void *, size_t *, size_t, size_t, size_t, _Bool)");
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = eltsize;
  uVar5 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0);
  uVar1 = *allocated;
  if (uVar5 < uVar1) {
    __assert_fail("oldsize <= maxsize",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/memory.c"
                  ,0x5e,"void *safegrowarray(void *, size_t *, size_t, size_t, size_t, _Bool)");
  }
  if (uVar5 < oldlen) {
    __assert_fail("oldlen <= maxsize",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/memory.c"
                  ,0x5f,"void *safegrowarray(void *, size_t *, size_t, size_t, size_t, _Bool)");
  }
  if (uVar5 - oldlen < extralen) {
    __assert_fail("extralen <= maxsize - oldlen",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/memory.c"
                  ,0x60,"void *safegrowarray(void *, size_t *, size_t, size_t, size_t, _Bool)");
  }
  ptr_local = ptr;
  if (uVar1 <= oldlen + extralen) {
    maxincr = (oldlen + extralen) - uVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = eltsize;
    if (maxincr < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100)) / auVar3,0)) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = eltsize;
      maxincr = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100)) / auVar4,0);
    }
    if (maxincr < uVar1 >> 4) {
      maxincr = uVar1 >> 4;
    }
    if (uVar5 - uVar1 < maxincr) {
      maxincr = uVar5 - uVar1;
    }
    n = uVar1 + maxincr;
    if (secret) {
      local_70 = safemalloc(n,eltsize,0);
      if (uVar1 != 0) {
        memcpy(local_70,ptr,uVar1 * eltsize);
        smemclr(ptr,uVar1 * eltsize);
        safefree(ptr);
      }
    }
    else {
      local_70 = saferealloc(ptr,n,eltsize);
    }
    *allocated = n;
    ptr_local = local_70;
  }
  return ptr_local;
}

Assistant:

void *safegrowarray(void *ptr, size_t *allocated, size_t eltsize,
                    size_t oldlen, size_t extralen, bool secret)
{
    /* The largest value we can safely multiply by eltsize */
    assert(eltsize > 0);
    size_t maxsize = (~(size_t)0) / eltsize;

    size_t oldsize = *allocated;

    /* Range-check the input values */
    assert(oldsize <= maxsize);
    assert(oldlen <= maxsize);
    assert(extralen <= maxsize - oldlen);

    /* If the size is already enough, don't bother doing anything! */
    if (oldsize > oldlen + extralen)
        return ptr;

    /* Find out how much we need to grow the array by. */
    size_t increment = (oldlen + extralen) - oldsize;

    /* Invent a new size. We want to grow the array by at least
     * 'increment' elements; by at least a fixed number of bytes (to
     * get things started when sizes are small); and by some constant
     * factor of its old size (to avoid repeated calls to this
     * function taking quadratic time overall). */
    if (increment < 256 / eltsize)
        increment = 256 / eltsize;
    if (increment < oldsize / 16)
        increment = oldsize / 16;

    /* But we also can't grow beyond maxsize. */
    size_t maxincr = maxsize - oldsize;
    if (increment > maxincr)
        increment = maxincr;

    size_t newsize = oldsize + increment;
    void *toret;
    if (secret) {
        toret = safemalloc(newsize, eltsize, 0);
        if (oldsize) {
            memcpy(toret, ptr, oldsize * eltsize);
            smemclr(ptr, oldsize * eltsize);
            sfree(ptr);
        }
    } else {
        toret = saferealloc(ptr, newsize, eltsize);
    }
    *allocated = newsize;
    return toret;
}